

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-strtod.cc
# Opt level: O2

void TestStrtod(void)

{
  double_conversion *pdVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  uint uVar2;
  double dVar3;
  Vector<const_char> VVar4;
  Vector<const_char> buffer;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  Vector<const_char> buffer_02;
  Vector<const_char> buffer_03;
  Vector<const_char> buffer_04;
  Vector<const_char> buffer_05;
  Vector<const_char> buffer_06;
  Vector<const_char> buffer_07;
  Vector<const_char> buffer_08;
  Vector<const_char> buffer_09;
  Vector<const_char> buffer_10;
  Vector<const_char> buffer_11;
  Vector<const_char> buffer_12;
  Vector<const_char> buffer_13;
  Vector<const_char> buffer_14;
  Vector<const_char> buffer_15;
  Vector<const_char> buffer_16;
  Vector<const_char> buffer_17;
  Vector<const_char> buffer_18;
  Vector<const_char> buffer_19;
  Vector<const_char> buffer_20;
  Vector<const_char> buffer_21;
  Vector<const_char> buffer_22;
  Vector<const_char> buffer_23;
  Vector<const_char> buffer_24;
  Vector<const_char> buffer_25;
  Vector<const_char> buffer_26;
  Vector<const_char> buffer_27;
  Vector<const_char> buffer_28;
  Vector<const_char> buffer_29;
  Vector<const_char> buffer_30;
  Vector<const_char> buffer_31;
  Vector<const_char> buffer_32;
  Vector<const_char> buffer_33;
  Vector<const_char> buffer_34;
  Vector<const_char> buffer_35;
  Vector<const_char> buffer_36;
  Vector<const_char> buffer_37;
  Vector<const_char> buffer_38;
  Vector<const_char> buffer_39;
  Vector<const_char> buffer_40;
  Vector<const_char> buffer_41;
  Vector<const_char> buffer_42;
  Vector<const_char> buffer_43;
  Vector<const_char> buffer_44;
  Vector<const_char> buffer_45;
  Vector<const_char> buffer_46;
  Vector<const_char> buffer_47;
  Vector<const_char> buffer_48;
  Vector<const_char> buffer_49;
  Vector<const_char> buffer_50;
  Vector<const_char> buffer_51;
  Vector<const_char> buffer_52;
  Vector<const_char> buffer_53;
  Vector<const_char> buffer_54;
  Vector<const_char> buffer_55;
  Vector<const_char> buffer_56;
  Vector<const_char> buffer_57;
  Vector<const_char> buffer_58;
  Vector<const_char> buffer_59;
  Vector<const_char> buffer_60;
  Vector<const_char> buffer_61;
  Vector<const_char> buffer_62;
  Vector<const_char> buffer_63;
  Vector<const_char> buffer_64;
  Vector<const_char> buffer_65;
  Vector<const_char> buffer_66;
  Vector<const_char> buffer_67;
  Vector<const_char> buffer_68;
  Vector<const_char> buffer_69;
  Vector<const_char> buffer_70;
  Vector<const_char> buffer_71;
  Vector<const_char> buffer_72;
  Vector<const_char> buffer_73;
  Vector<const_char> buffer_74;
  Vector<const_char> buffer_75;
  Vector<const_char> buffer_76;
  Vector<const_char> buffer_77;
  Vector<const_char> buffer_78;
  Vector<const_char> buffer_79;
  Vector<const_char> buffer_80;
  Vector<const_char> buffer_81;
  Vector<const_char> buffer_82;
  Vector<const_char> buffer_83;
  Vector<const_char> buffer_84;
  Vector<const_char> buffer_85;
  Vector<const_char> buffer_86;
  Vector<const_char> buffer_87;
  Vector<const_char> buffer_88;
  Vector<const_char> buffer_89;
  Vector<const_char> buffer_90;
  Vector<const_char> buffer_91;
  Vector<const_char> buffer_92;
  Vector<const_char> buffer_93;
  Vector<const_char> buffer_94;
  Vector<const_char> buffer_95;
  Vector<const_char> buffer_96;
  Vector<const_char> buffer_97;
  Vector<const_char> buffer_98;
  Vector<const_char> buffer_99;
  Vector<const_char> buffer_x00100;
  Vector<const_char> buffer_x00101;
  Vector<const_char> buffer_x00102;
  Vector<const_char> buffer_x00103;
  Vector<const_char> buffer_x00104;
  Vector<const_char> buffer_x00105;
  
  VVar4 = StringToVector("0");
  pdVar1 = (double_conversion *)VVar4.start_;
  uVar2 = VVar4.length_;
  VVar4.start_ = (char *)(ulong)uVar2;
  VVar4._8_8_ = 1;
  dVar3 = double_conversion::Strtod(pdVar1,VVar4,in_ECX);
  CheckEqualsHelper((char *)0x3f,0xc0f3fe,"Strtod(vector, 1)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer.start_ = (char *)(ulong)uVar2;
  buffer._8_8_ = 2;
  dVar3 = double_conversion::Strtod(pdVar1,buffer,in_ECX);
  CheckEqualsHelper((char *)0x40,0xc0f3fe,"Strtod(vector, 2)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_00.start_ = (char *)(ulong)uVar2;
  buffer_00._8_8_ = 0xfffffffffffffffe;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_00,in_ECX);
  CheckEqualsHelper((char *)0x41,0xc0f3fe,"Strtod(vector, -2)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_01.start_ = (char *)(ulong)uVar2;
  buffer_01._8_8_ = 0xfffffc19;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_01,in_ECX);
  CheckEqualsHelper((char *)0x42,0xc0f3fe,"Strtod(vector, -999)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_02.start_ = (char *)(ulong)uVar2;
  buffer_02._8_8_ = 999;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_02,in_ECX);
  CheckEqualsHelper((char *)0x43,0xc0f3fe,"Strtod(vector, +999)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  VVar4 = StringToVector("1");
  pdVar1 = (double_conversion *)VVar4.start_;
  uVar2 = VVar4.length_;
  dVar3 = double_conversion::Strtod(pdVar1,(Vector<const_char>)ZEXT416(uVar2),in_ECX);
  CheckEqualsHelper((char *)0x46,0xc15dcd,"Strtod(vector, 0)",1.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_03.start_ = (char *)(ulong)uVar2;
  buffer_03._8_8_ = 1;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_03,in_ECX);
  CheckEqualsHelper((char *)0x47,0xc14bc5,"Strtod(vector, 1)",10.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_04.start_ = (char *)(ulong)uVar2;
  buffer_04._8_8_ = 2;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_04,in_ECX);
  CheckEqualsHelper((char *)0x48,0xc1dbe8,"Strtod(vector, 2)",100.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_05.start_ = (char *)(ulong)uVar2;
  buffer_05._8_8_ = 0x14;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_05,in_ECX);
  CheckEqualsHelper((char *)0x49,0xc1dbee,"Strtod(vector, 20)",1e+20,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_06.start_ = (char *)(ulong)uVar2;
  buffer_06._8_8_ = 0x16;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_06,in_ECX);
  CheckEqualsHelper((char *)0x4a,0xc1dc06,"Strtod(vector, 22)",1e+22,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_07.start_ = (char *)(ulong)uVar2;
  buffer_07._8_8_ = 0x17;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_07,in_ECX);
  CheckEqualsHelper((char *)0x4b,0xc1dc1e,"Strtod(vector, 23)",1e+23,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_08.start_ = (char *)(ulong)uVar2;
  buffer_08._8_8_ = 0x23;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_08,in_ECX);
  CheckEqualsHelper((char *)0x4c,0xc1dc36,"Strtod(vector, 35)",1e+35,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_09.start_ = (char *)(ulong)uVar2;
  buffer_09._8_8_ = 0x24;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_09,in_ECX);
  CheckEqualsHelper((char *)0x4d,0xc1dc4e,"Strtod(vector, 36)",1e+36,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_10.start_ = (char *)(ulong)uVar2;
  buffer_10._8_8_ = 0x25;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_10,in_ECX);
  CheckEqualsHelper((char *)0x4e,0xc1dc66,"Strtod(vector, 37)",1e+37,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_11.start_ = (char *)(ulong)uVar2;
  buffer_11._8_8_ = 0xffffffffffffffff;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_11,in_ECX);
  CheckEqualsHelper((char *)0x4f,0xc12546,"Strtod(vector, -1)",0.1,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_12.start_ = (char *)(ulong)uVar2;
  buffer_12._8_8_ = 0xfffffffffffffffe;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_12,in_ECX);
  CheckEqualsHelper((char *)0x50,0xc0e3d4,"Strtod(vector, -2)",0.01,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_13.start_ = (char *)(ulong)uVar2;
  buffer_13._8_8_ = 0xfffffffffffffffb;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_13,in_ECX);
  CheckEqualsHelper((char *)0x51,0xc1dc91,"Strtod(vector, -5)",1e-05,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_14.start_ = (char *)(ulong)uVar2;
  buffer_14._8_8_ = 0xffffffffffffffec;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_14,in_ECX);
  CheckEqualsHelper((char *)0x52,0xc1dca9,"Strtod(vector, -20)",1e-20,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_15.start_ = (char *)(ulong)uVar2;
  buffer_15._8_8_ = 0xffffffffffffffea;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_15,in_ECX);
  CheckEqualsHelper((char *)0x53,0xc1dcc3,"Strtod(vector, -22)",1e-22,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_16.start_ = (char *)(ulong)uVar2;
  buffer_16._8_8_ = 0xffffffffffffffe9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_16,in_ECX);
  CheckEqualsHelper((char *)0x54,0xc0dd01,"Strtod(vector, -23)",1e-23,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_17.start_ = (char *)(ulong)uVar2;
  buffer_17._8_8_ = 0xffffffffffffffe7;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_17,in_ECX);
  CheckEqualsHelper((char *)0x55,0xc1dcf1,"Strtod(vector, -25)",1e-25,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_18.start_ = (char *)(ulong)uVar2;
  buffer_18._8_8_ = 0xffffffffffffffd9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_18,in_ECX);
  CheckEqualsHelper((char *)0x56,0xc1dd0b,"Strtod(vector, -39)",1e-39,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  VVar4 = StringToVector("2");
  pdVar1 = (double_conversion *)VVar4.start_;
  uVar2 = VVar4.length_;
  dVar3 = double_conversion::Strtod(pdVar1,(Vector<const_char>)ZEXT416(uVar2),in_ECX);
  CheckEqualsHelper((char *)0x59,0xc13198,"Strtod(vector, 0)",2.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_19.start_ = (char *)(ulong)uVar2;
  buffer_19._8_8_ = 1;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_19,in_ECX);
  CheckEqualsHelper((char *)0x5a,0xc1dd25,"Strtod(vector, 1)",20.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_20.start_ = (char *)(ulong)uVar2;
  buffer_20._8_8_ = 2;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_20,in_ECX);
  CheckEqualsHelper((char *)0x5b,0xc1dd2a,"Strtod(vector, 2)",200.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_21.start_ = (char *)(ulong)uVar2;
  buffer_21._8_8_ = 0x14;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_21,in_ECX);
  CheckEqualsHelper((char *)0x5c,0xc1dd30,"Strtod(vector, 20)",2e+20,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_22.start_ = (char *)(ulong)uVar2;
  buffer_22._8_8_ = 0x16;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_22,in_ECX);
  CheckEqualsHelper((char *)0x5d,0xc1dd35,"Strtod(vector, 22)",2e+22,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_23.start_ = (char *)(ulong)uVar2;
  buffer_23._8_8_ = 0x17;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_23,in_ECX);
  CheckEqualsHelper((char *)0x5e,0xc1dd3a,"Strtod(vector, 23)",2e+23,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_24.start_ = (char *)(ulong)uVar2;
  buffer_24._8_8_ = 0x23;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_24,in_ECX);
  CheckEqualsHelper((char *)0x5f,0xc1dd3f,"Strtod(vector, 35)",2e+35,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_25.start_ = (char *)(ulong)uVar2;
  buffer_25._8_8_ = 0x24;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_25,in_ECX);
  CheckEqualsHelper((char *)0x60,0xc1dd44,"Strtod(vector, 36)",2e+36,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_26.start_ = (char *)(ulong)uVar2;
  buffer_26._8_8_ = 0x25;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_26,in_ECX);
  CheckEqualsHelper((char *)0x61,0xc1dd49,"Strtod(vector, 37)",2e+37,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_27.start_ = (char *)(ulong)uVar2;
  buffer_27._8_8_ = 0xffffffff;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_27,in_ECX);
  CheckEqualsHelper((char *)0x62,0xc125b9,"Strtod(vector, -1)",0.2,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_28.start_ = (char *)(ulong)uVar2;
  buffer_28._8_8_ = 0xfffffffffffffffe;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_28,in_ECX);
  CheckEqualsHelper((char *)0x63,0xc1dd4e,"Strtod(vector, -2)",0.02,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_29.start_ = (char *)(ulong)uVar2;
  buffer_29._8_8_ = 0xfffffffffffffffb;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_29,in_ECX);
  CheckEqualsHelper((char *)0x64,0xc1dd53,"Strtod(vector, -5)",2e-05,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_30.start_ = (char *)(ulong)uVar2;
  buffer_30._8_8_ = 0xffffffffffffffec;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_30,in_ECX);
  CheckEqualsHelper((char *)0x65,0xc1dd58,"Strtod(vector, -20)",2e-20,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_31.start_ = (char *)(ulong)uVar2;
  buffer_31._8_8_ = 0xffffffffffffffea;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_31,in_ECX);
  CheckEqualsHelper((char *)0x66,0xc1dd5e,"Strtod(vector, -22)",2e-22,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_32.start_ = (char *)(ulong)uVar2;
  buffer_32._8_8_ = 0xffffffffffffffe9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_32,in_ECX);
  CheckEqualsHelper((char *)0x67,0xc1dd64,"Strtod(vector, -23)",2e-23,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_33.start_ = (char *)(ulong)uVar2;
  buffer_33._8_8_ = 0xffffffffffffffe7;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_33,in_ECX);
  CheckEqualsHelper((char *)0x68,0xc1dd6a,"Strtod(vector, -25)",2e-25,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_34.start_ = (char *)(ulong)uVar2;
  buffer_34._8_8_ = 0xffffffffffffffd9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_34,in_ECX);
  CheckEqualsHelper((char *)0x69,0xc1dd70,"Strtod(vector, -39)",2e-39,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  VVar4 = StringToVector("9");
  pdVar1 = (double_conversion *)VVar4.start_;
  uVar2 = VVar4.length_;
  dVar3 = double_conversion::Strtod(pdVar1,(Vector<const_char>)ZEXT416(uVar2),in_ECX);
  CheckEqualsHelper((char *)0x6c,0xc16e92,"Strtod(vector, 0)",9.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_35.start_ = (char *)(ulong)uVar2;
  buffer_35._8_8_ = 1;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_35,in_ECX);
  CheckEqualsHelper((char *)0x6d,0xc1dd76,"Strtod(vector, 1)",90.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_36.start_ = (char *)(ulong)uVar2;
  buffer_36._8_8_ = 2;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_36,in_ECX);
  CheckEqualsHelper((char *)0x6e,0xc1dd7b,"Strtod(vector, 2)",900.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_37.start_ = (char *)(ulong)uVar2;
  buffer_37._8_8_ = 0x14;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_37,in_ECX);
  CheckEqualsHelper((char *)0x6f,0xc1dd81,"Strtod(vector, 20)",9e+20,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_38.start_ = (char *)(ulong)uVar2;
  buffer_38._8_8_ = 0x16;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_38,in_ECX);
  CheckEqualsHelper((char *)0x70,0xc1dd86,"Strtod(vector, 22)",9e+22,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_39.start_ = (char *)(ulong)uVar2;
  buffer_39._8_8_ = 0x17;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_39,in_ECX);
  CheckEqualsHelper((char *)0x71,0xc1dd8b,"Strtod(vector, 23)",9e+23,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_40.start_ = (char *)(ulong)uVar2;
  buffer_40._8_8_ = 0x23;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_40,in_ECX);
  CheckEqualsHelper((char *)0x72,0xc1dd90,"Strtod(vector, 35)",9e+35,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_41.start_ = (char *)(ulong)uVar2;
  buffer_41._8_8_ = 0x24;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_41,in_ECX);
  CheckEqualsHelper((char *)0x73,0xc1dd95,"Strtod(vector, 36)",9e+36,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_42.start_ = (char *)(ulong)uVar2;
  buffer_42._8_8_ = 0x25;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_42,in_ECX);
  CheckEqualsHelper((char *)0x74,0xc1dd9a,"Strtod(vector, 37)",9e+37,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_43.start_ = (char *)(ulong)uVar2;
  buffer_43._8_8_ = 0xffffffff;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_43,in_ECX);
  CheckEqualsHelper((char *)0x75,0xc1dd9f,"Strtod(vector, -1)",0.9,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_44.start_ = (char *)(ulong)uVar2;
  buffer_44._8_8_ = 0xfffffffffffffffe;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_44,in_ECX);
  CheckEqualsHelper((char *)0x76,0xc1dda4,"Strtod(vector, -2)",0.09,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_45.start_ = (char *)(ulong)uVar2;
  buffer_45._8_8_ = 0xfffffffffffffffb;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_45,in_ECX);
  CheckEqualsHelper((char *)0x77,0xc1dda9,"Strtod(vector, -5)",9e-05,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_46.start_ = (char *)(ulong)uVar2;
  buffer_46._8_8_ = 0xffffffffffffffec;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_46,in_ECX);
  CheckEqualsHelper((char *)0x78,0xc1ddae,"Strtod(vector, -20)",9e-20,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_47.start_ = (char *)(ulong)uVar2;
  buffer_47._8_8_ = 0xffffffffffffffea;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_47,in_ECX);
  CheckEqualsHelper((char *)0x79,0xc1ddb4,"Strtod(vector, -22)",9e-22,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_48.start_ = (char *)(ulong)uVar2;
  buffer_48._8_8_ = 0xffffffffffffffe9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_48,in_ECX);
  CheckEqualsHelper((char *)0x7a,0xc1ddba,"Strtod(vector, -23)",9e-23,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_49.start_ = (char *)(ulong)uVar2;
  buffer_49._8_8_ = 0xffffffffffffffe7;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_49,in_ECX);
  CheckEqualsHelper((char *)0x7b,0xc1ddc0,"Strtod(vector, -25)",9e-25,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_50.start_ = (char *)(ulong)uVar2;
  buffer_50._8_8_ = 0xffffffffffffffd9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_50,in_ECX);
  CheckEqualsHelper((char *)0x7c,0xc1ddc6,"Strtod(vector, -39)",9e-39,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  VVar4 = StringToVector("12345");
  pdVar1 = (double_conversion *)VVar4.start_;
  uVar2 = VVar4.length_;
  dVar3 = double_conversion::Strtod(pdVar1,(Vector<const_char>)ZEXT416(uVar2),in_ECX);
  CheckEqualsHelper((char *)0x7f,0xc1df97,"Strtod(vector, 0)",12345.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_51.start_ = (char *)(ulong)uVar2;
  buffer_51._8_8_ = 1;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_51,in_ECX);
  CheckEqualsHelper((char *)0x80,0xc1dfa9,"Strtod(vector, 1)",123450.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_52.start_ = (char *)(ulong)uVar2;
  buffer_52._8_8_ = 2;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_52,in_ECX);
  CheckEqualsHelper((char *)0x81,0xc1dfbc,"Strtod(vector, 2)",1234500.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_53.start_ = (char *)(ulong)uVar2;
  buffer_53._8_8_ = 0x14;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_53,in_ECX);
  CheckEqualsHelper((char *)0x82,0xc1dfd0,"Strtod(vector, 20)",1.2345e+24,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_54.start_ = (char *)(ulong)uVar2;
  buffer_54._8_8_ = 0x16;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_54,in_ECX);
  CheckEqualsHelper((char *)0x83,0xc1dfe3,"Strtod(vector, 22)",1.2345e+26,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_55.start_ = (char *)(ulong)uVar2;
  buffer_55._8_8_ = 0x17;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_55,in_ECX);
  CheckEqualsHelper((char *)0x84,0xc1dff6,"Strtod(vector, 23)",1.2345e+27,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_56.start_ = (char *)(ulong)uVar2;
  buffer_56._8_8_ = 0x1e;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_56,in_ECX);
  CheckEqualsHelper((char *)0x85,0xc1ddcc,"Strtod(vector, 30)",1.2345e+34,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_57.start_ = (char *)(ulong)uVar2;
  buffer_57._8_8_ = 0x1f;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_57,in_ECX);
  CheckEqualsHelper((char *)0x86,0xc1dde8,"Strtod(vector, 31)",1.2345e+35,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_58.start_ = (char *)(ulong)uVar2;
  buffer_58._8_8_ = 0x20;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_58,in_ECX);
  CheckEqualsHelper((char *)0x87,0xc1de04,"Strtod(vector, 32)",1.2345e+36,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_59.start_ = (char *)(ulong)uVar2;
  buffer_59._8_8_ = 0x23;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_59,in_ECX);
  CheckEqualsHelper((char *)0x88,0xc1e009,"Strtod(vector, 35)",1.2345e+39,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_60.start_ = (char *)(ulong)uVar2;
  buffer_60._8_8_ = 0x24;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_60,in_ECX);
  CheckEqualsHelper((char *)0x89,0xc1e01c,"Strtod(vector, 36)",1.2345e+40,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_61.start_ = (char *)(ulong)uVar2;
  buffer_61._8_8_ = 0x25;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_61,in_ECX);
  CheckEqualsHelper((char *)0x8a,0xc1e02f,"Strtod(vector, 37)",1.2345e+41,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_62.start_ = (char *)(ulong)uVar2;
  buffer_62._8_8_ = 0xffffffff;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_62,in_ECX);
  CheckEqualsHelper((char *)0x8b,0xc1e068,"Strtod(vector, -1)",1234.5,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_63.start_ = (char *)(ulong)uVar2;
  buffer_63._8_8_ = 0xfffffffe;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_63,in_ECX);
  CheckEqualsHelper((char *)0x8c,0xc1e07b,"Strtod(vector, -2)",123.45,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_64.start_ = (char *)(ulong)uVar2;
  buffer_64._8_8_ = 0xfffffffb;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_64,in_ECX);
  CheckEqualsHelper((char *)0x8d,0xc1e08e,"Strtod(vector, -5)",0.12345,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_65.start_ = (char *)(ulong)uVar2;
  buffer_65._8_8_ = 0xffffffffffffffec;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_65,in_ECX);
  CheckEqualsHelper((char *)0x8e,0xc1e0a1,"Strtod(vector, -20)",1.2345e-16,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_66.start_ = (char *)(ulong)uVar2;
  buffer_66._8_8_ = 0xffffffea;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_66,in_ECX);
  CheckEqualsHelper((char *)0x8f,0xc1e0b5,"Strtod(vector, -22)",1.2345e-18,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_67.start_ = (char *)(ulong)uVar2;
  buffer_67._8_8_ = 0xffffffe9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_67,in_ECX);
  CheckEqualsHelper((char *)0x90,0xc1e0c9,"Strtod(vector, -23)",1.2345e-19,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_68.start_ = (char *)(ulong)uVar2;
  buffer_68._8_8_ = 0xffffffffffffffe7;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_68,in_ECX);
  CheckEqualsHelper((char *)0x91,0xc1e0dd,"Strtod(vector, -25)",1.2345e-21,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_69.start_ = (char *)(ulong)uVar2;
  buffer_69._8_8_ = 0xffffffffffffffd9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_69,in_ECX);
  CheckEqualsHelper((char *)0x92,0xc1e0f1,"Strtod(vector, -39)",1.2345e-35,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  VVar4 = StringToVector("12345678901234");
  pdVar1 = (double_conversion *)VVar4.start_;
  uVar2 = VVar4.length_;
  dVar3 = double_conversion::Strtod(pdVar1,(Vector<const_char>)ZEXT416(uVar2),in_ECX);
  CheckEqualsHelper((char *)0x95,0xc1de20,"Strtod(vector, 0)",12345678901234.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_70.start_ = (char *)(ulong)uVar2;
  buffer_70._8_8_ = 1;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_70,in_ECX);
  CheckEqualsHelper((char *)0x96,0xc1de31,"Strtod(vector, 1)",123456789012340.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_71.start_ = (char *)(ulong)uVar2;
  buffer_71._8_8_ = 2;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_71,in_ECX);
  CheckEqualsHelper((char *)0x97,0xc1de43,"Strtod(vector, 2)",1.2345678901234e+15,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_72.start_ = (char *)(ulong)uVar2;
  buffer_72._8_8_ = 0x14;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_72,in_ECX);
  CheckEqualsHelper((char *)0x98,0xc1de56,"Strtod(vector, 20)",1.2345678901234e+33,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_73.start_ = (char *)(ulong)uVar2;
  buffer_73._8_8_ = 0x16;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_73,in_ECX);
  CheckEqualsHelper((char *)0x99,0xc1de68,"Strtod(vector, 22)",1.2345678901234e+35,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_74.start_ = (char *)(ulong)uVar2;
  buffer_74._8_8_ = 0x17;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_74,in_ECX);
  CheckEqualsHelper((char *)0x9a,0xc1de7a,"Strtod(vector, 23)",1.2345678901234e+36,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_75.start_ = (char *)(ulong)uVar2;
  buffer_75._8_8_ = 0x1e;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_75,in_ECX);
  CheckEqualsHelper((char *)0x9b,0xc1de8c,"Strtod(vector, 30)",1.2345678901234e+43,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_76.start_ = (char *)(ulong)uVar2;
  buffer_76._8_8_ = 0x1f;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_76,in_ECX);
  CheckEqualsHelper((char *)0x9c,0xc1de9e,"Strtod(vector, 31)",1.2345678901234e+44,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_77.start_ = (char *)(ulong)uVar2;
  buffer_77._8_8_ = 0x20;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_77,in_ECX);
  CheckEqualsHelper((char *)0x9d,0xc1deb0,"Strtod(vector, 32)",1.2345678901234e+45,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_78.start_ = (char *)(ulong)uVar2;
  buffer_78._8_8_ = 0x23;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_78,in_ECX);
  CheckEqualsHelper((char *)0x9e,0xc1dec2,"Strtod(vector, 35)",1.2345678901234e+48,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_79.start_ = (char *)(ulong)uVar2;
  buffer_79._8_8_ = 0x24;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_79,in_ECX);
  CheckEqualsHelper((char *)0x9f,0xc1ded4,"Strtod(vector, 36)",1.2345678901234e+49,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_80.start_ = (char *)(ulong)uVar2;
  buffer_80._8_8_ = 0x25;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_80,in_ECX);
  CheckEqualsHelper((char *)0xa0,0xc1dee6,"Strtod(vector, 37)",1.2345678901234e+50,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_81.start_ = (char *)(ulong)uVar2;
  buffer_81._8_8_ = 0xffffffffffffffff;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_81,in_ECX);
  CheckEqualsHelper((char *)0xa1,0xc1def8,"Strtod(vector, -1)",1234567890123.4,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_82.start_ = (char *)(ulong)uVar2;
  buffer_82._8_8_ = 0xfffffffffffffffe;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_82,in_ECX);
  CheckEqualsHelper((char *)0xa2,0xc1df0a,"Strtod(vector, -2)",123456789012.34,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_83.start_ = (char *)(ulong)uVar2;
  buffer_83._8_8_ = 0xfffffffb;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_83,in_ECX);
  CheckEqualsHelper((char *)0xa3,0xc1df1c,"Strtod(vector, -5)",123456789.01234,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_84.start_ = (char *)(ulong)uVar2;
  buffer_84._8_8_ = 0xffffffffffffffec;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_84,in_ECX);
  CheckEqualsHelper((char *)0xa4,0xc1df2e,"Strtod(vector, -20)",1.2345678901234e-07,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_85.start_ = (char *)(ulong)uVar2;
  buffer_85._8_8_ = 0xffffffea;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_85,in_ECX);
  CheckEqualsHelper((char *)0xa5,0xc1df41,"Strtod(vector, -22)",1.2345678901234e-09,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_86.start_ = (char *)(ulong)uVar2;
  buffer_86._8_8_ = 0xffffffe9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_86,in_ECX);
  CheckEqualsHelper((char *)0xa6,0xc1df54,"Strtod(vector, -23)",1.2345678901234e-10,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_87.start_ = (char *)(ulong)uVar2;
  buffer_87._8_8_ = 0xffffffffffffffe7;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_87,in_ECX);
  CheckEqualsHelper((char *)0xa7,0xc1df67,"Strtod(vector, -25)",1.2345678901234e-12,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_88.start_ = (char *)(ulong)uVar2;
  buffer_88._8_8_ = 0xffffffd9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_88,in_ECX);
  CheckEqualsHelper((char *)0xa8,0xc1df7a,"Strtod(vector, -39)",1.2345678901234e-26,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  VVar4 = StringToVector("123456789012345");
  pdVar1 = (double_conversion *)VVar4.start_;
  uVar2 = VVar4.length_;
  dVar3 = double_conversion::Strtod(pdVar1,(Vector<const_char>)ZEXT416(uVar2),in_ECX);
  CheckEqualsHelper((char *)0xab,0xc1df8d,"Strtod(vector, 0)",123456789012345.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_89.start_ = (char *)(ulong)uVar2;
  buffer_89._8_8_ = 1;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_89,in_ECX);
  CheckEqualsHelper((char *)0xac,0xc1df9f,"Strtod(vector, 1)",1.23456789012345e+15,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_90.start_ = (char *)(ulong)uVar2;
  buffer_90._8_8_ = 2;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_90,in_ECX);
  CheckEqualsHelper((char *)0xad,0xc1dfb2,"Strtod(vector, 2)",1.23456789012345e+16,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_91.start_ = (char *)(ulong)uVar2;
  buffer_91._8_8_ = 0x14;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_91,in_ECX);
  CheckEqualsHelper((char *)0xae,0xc1dfc6,"Strtod(vector, 20)",1.23456789012345e+34,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_92.start_ = (char *)(ulong)uVar2;
  buffer_92._8_8_ = 0x16;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_92,in_ECX);
  CheckEqualsHelper((char *)0xaf,0xc1dfd9,"Strtod(vector, 22)",1.23456789012345e+36,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_93.start_ = (char *)(ulong)uVar2;
  buffer_93._8_8_ = 0x17;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_93,in_ECX);
  CheckEqualsHelper((char *)0xb0,0xc1dfec,"Strtod(vector, 23)",1.23456789012345e+37,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_94.start_ = (char *)(ulong)uVar2;
  buffer_94._8_8_ = 0x23;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_94,in_ECX);
  CheckEqualsHelper((char *)0xb1,0xc1dfff,"Strtod(vector, 35)",1.23456789012345e+49,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_95.start_ = (char *)(ulong)uVar2;
  buffer_95._8_8_ = 0x24;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_95,in_ECX);
  CheckEqualsHelper((char *)0xb2,0xc1e012,"Strtod(vector, 36)",1.23456789012345e+50,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_96.start_ = (char *)(ulong)uVar2;
  buffer_96._8_8_ = 0x25;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_96,in_ECX);
  CheckEqualsHelper((char *)0xb3,0xc1e025,"Strtod(vector, 37)",1.23456789012345e+51,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_97.start_ = (char *)(ulong)uVar2;
  buffer_97._8_8_ = 0x27;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_97,in_ECX);
  CheckEqualsHelper((char *)0xb4,0xc1e038,"Strtod(vector, 39)",1.23456789012345e+53,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_98.start_ = (char *)(ulong)uVar2;
  buffer_98._8_8_ = 0xffffffffffffffff;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_98,in_ECX);
  CheckEqualsHelper((char *)0xb5,0xc1e05e,"Strtod(vector, -1)",12345678901234.5,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_99.start_ = (char *)(ulong)uVar2;
  buffer_99._8_8_ = 0xfffffffffffffffe;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_99,in_ECX);
  CheckEqualsHelper((char *)0xb6,0xc1e071,"Strtod(vector, -2)",1234567890123.45,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_x00100.start_ = (char *)(ulong)uVar2;
  buffer_x00100._8_8_ = 0xfffffffffffffffb;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_x00100,in_ECX);
  CheckEqualsHelper((char *)0xb7,0xc1e084,"Strtod(vector, -5)",1234567890.12345,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_x00101.start_ = (char *)(ulong)uVar2;
  buffer_x00101._8_8_ = 0xffffffffffffffec;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_x00101,in_ECX);
  CheckEqualsHelper((char *)0xb8,0xc1e097,"Strtod(vector, -20)",1.23456789012345e-06,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_x00102.start_ = (char *)(ulong)uVar2;
  buffer_x00102._8_8_ = 0xffffffea;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_x00102,in_ECX);
  CheckEqualsHelper((char *)0xb9,0xc1e0ab,"Strtod(vector, -22)",1.23456789012345e-08,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_x00103.start_ = (char *)(ulong)uVar2;
  buffer_x00103._8_8_ = 0xffffffe9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_x00103,in_ECX);
  CheckEqualsHelper((char *)0xba,0xc1e0bf,"Strtod(vector, -23)",1.23456789012345e-09,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_x00104.start_ = (char *)(ulong)uVar2;
  buffer_x00104._8_8_ = 0xffffffffffffffe7;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_x00104,in_ECX);
  CheckEqualsHelper((char *)0xbb,0xc1e0d3,"Strtod(vector, -25)",1.23456789012345e-11,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  buffer_x00105.start_ = (char *)(ulong)uVar2;
  buffer_x00105._8_8_ = 0xffffffd9;
  dVar3 = double_conversion::Strtod(pdVar1,buffer_x00105,in_ECX);
  CheckEqualsHelper((char *)0xbc,0xc1e0e7,"Strtod(vector, -39)",1.23456789012345e-25,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0",0x3039);
  CheckEqualsHelper((char *)0xbe,0xc0f3fe,"StrtodChar(\"0\", 12345)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("",0x52c);
  CheckEqualsHelper((char *)0xbf,0xc0f3fe,"StrtodChar(\"\", 1324)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("000000000",0x7b);
  CheckEqualsHelper((char *)0xc0,0xc0f3fe,"StrtodChar(\"000000000\", 123)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("2",-0x144);
  CheckEqualsHelper((char *)0xc1,0xc0f3fe,"StrtodChar(\"2\", -324)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("3",-0x144);
  CheckEqualsHelper((char *)0xc2,0xc1d228,"StrtodChar(\"3\", -324)",4.94065645841247e-324,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1",-0x145);
  CheckEqualsHelper((char *)0xc6,0xc0f3fe,"StrtodChar(\"1\", -325)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1",-0x145);
  CheckEqualsHelper((char *)0xc7,0xc0f3fe,"StrtodChar(\"1\", -325)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("20000",-0x148);
  CheckEqualsHelper((char *)0xc8,0xc0f3fe,"StrtodChar(\"20000\", -328)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("30000",-0x148);
  CheckEqualsHelper((char *)0xc9,0xc1e1a0,"StrtodChar(\"30000\", -328)",4.94065645841247e-324,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("10000",-0x149);
  CheckEqualsHelper((char *)0xca,0xc0f3fe,"StrtodChar(\"10000\", -329)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("90000",-0x149);
  CheckEqualsHelper((char *)0xcb,0xc0f3fe,"StrtodChar(\"90000\", -329)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("000000001",-0x145);
  CheckEqualsHelper((char *)0xcc,0xc0f3fe,"StrtodChar(\"000000001\", -325)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("000000001",-0x145);
  CheckEqualsHelper((char *)0xcd,0xc0f3fe,"StrtodChar(\"000000001\", -325)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0000000020000",-0x148);
  CheckEqualsHelper((char *)0xce,0xc0f3fe,"StrtodChar(\"0000000020000\", -328)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("00000030000",-0x148);
  CheckEqualsHelper((char *)0xcf,0xc1e1a0,"StrtodChar(\"00000030000\", -328)",4.94065645841247e-324,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0000000010000",-0x149);
  CheckEqualsHelper((char *)0xd0,0xc0f3fe,"StrtodChar(\"0000000010000\", -329)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0000000090000",-0x149);
  CheckEqualsHelper((char *)0xd1,0xc0f3fe,"StrtodChar(\"0000000090000\", -329)",0.0,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1",0x135);
  CheckEqualsHelper((char *)0xd6,0xc198e1,"StrtodChar(\"1\", 309)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1",0x134);
  CheckEqualsHelper((char *)0xd7,0xc1e2e8,"StrtodChar(\"1\", 308)",1e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234",0x131);
  CheckEqualsHelper((char *)0xd8,0xc1e303,"StrtodChar(\"1234\", 305)",1.234e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234",0x130);
  CheckEqualsHelper((char *)0xd9,0xc1e324,"StrtodChar(\"1234\", 304)",1.234e+307,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("18",0x133);
  CheckEqualsHelper((char *)0xda,0xc198e1,"StrtodChar(\"18\", 307)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("17",0x133);
  CheckEqualsHelper((char *)0xdb,0xc1e35b,"StrtodChar(\"17\", 307)",1.7e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0000001",0x135);
  CheckEqualsHelper((char *)0xdc,0xc198e1,"StrtodChar(\"0000001\", 309)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("00000001",0x134);
  CheckEqualsHelper((char *)0xdd,0xc1e2e8,"StrtodChar(\"00000001\", 308)",1e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("00000001234",0x131);
  CheckEqualsHelper((char *)0xde,0xc1e303,"StrtodChar(\"00000001234\", 305)",1.234e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("000000001234",0x130);
  CheckEqualsHelper((char *)0xdf,0xc1e324,"StrtodChar(\"000000001234\", 304)",1.234e+307,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0000000018",0x133);
  CheckEqualsHelper((char *)0xe0,0xc198e1,"StrtodChar(\"0000000018\", 307)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0000000017",0x133);
  CheckEqualsHelper((char *)0xe1,0xc1e35b,"StrtodChar(\"0000000017\", 307)",1.7e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1000000",0x12f);
  CheckEqualsHelper((char *)0xe2,0xc198e1,"StrtodChar(\"1000000\", 303)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("100000",0x12f);
  CheckEqualsHelper((char *)0xe3,0xc1e2e8,"StrtodChar(\"100000\", 303)",1e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123400000",300);
  CheckEqualsHelper((char *)0xe4,0xc1e303,"StrtodChar(\"123400000\", 300)",1.234e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123400000",299);
  CheckEqualsHelper((char *)0xe5,0xc1e324,"StrtodChar(\"123400000\", 299)",1.234e+307,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("180000000",300);
  CheckEqualsHelper((char *)0xe6,0xc198e1,"StrtodChar(\"180000000\", 300)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("170000000",300);
  CheckEqualsHelper((char *)0xe7,0xc1e35b,"StrtodChar(\"170000000\", 300)",1.7e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("00000001000000",0x12f);
  CheckEqualsHelper((char *)0xe8,0xc198e1,"StrtodChar(\"00000001000000\", 303)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("000000000000100000",0x12f);
  CheckEqualsHelper((char *)0xe9,0xc1e2e8,"StrtodChar(\"000000000000100000\", 303)",1e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("00000000123400000",300);
  CheckEqualsHelper((char *)0xea,0xc1e303,"StrtodChar(\"00000000123400000\", 300)",1.234e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("0000000123400000",299);
  CheckEqualsHelper((char *)0xeb,0xc1e324,"StrtodChar(\"0000000123400000\", 299)",1.234e+307,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("00000000180000000",300);
  CheckEqualsHelper((char *)0xec,0xc198e1,"StrtodChar(\"00000000180000000\", 300)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("00000000170000000",300);
  CheckEqualsHelper((char *)0xed,0xc1e35b,"StrtodChar(\"00000000170000000\", 300)",1.7e+308,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("17976931348623157",0x124);
  CheckEqualsHelper((char *)0xee,0xc1e629,"StrtodChar(\"17976931348623157\", 292)",
                    1.79769313486232e+308,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("17976931348623158",0x124);
  CheckEqualsHelper((char *)0xef,0xc1e666,"StrtodChar(\"17976931348623158\", 292)",
                    1.79769313486232e+308,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("17976931348623159",0x124);
  CheckEqualsHelper((char *)0xf0,0xc198e1,"StrtodChar(\"17976931348623159\", 292)",INFINITY,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("89255",-0x16);
  CheckEqualsHelper((char *)0xf6,0xc1e6ec,"StrtodChar(\"89255\", -22)",8.9255e-18,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("358416272",-0x21);
  CheckEqualsHelper((char *)0xf9,0xc1e70f,"StrtodChar(\"358416272\", -33)",3.58416272e-25,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("104110013277974872254",-0xe1);
  CheckEqualsHelper((char *)0xfb,0xc1e744,"StrtodChar(\"104110013277974872254\", -225)",
                    1.0411001327797486e-205,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x6c);
  CheckEqualsHelper((char *)0xfd,0xc1e79f,"StrtodChar(\"123456789\", 108)",1.23456789e+116,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x6d);
  CheckEqualsHelper((char *)0xfe,0xc1e7ca,"StrtodChar(\"123456789\", 109)",1.23456789e+117,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x6e);
  CheckEqualsHelper((char *)0xff,0xc1e7f5,"StrtodChar(\"123456789\", 110)",1.23456789e+118,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x6f);
  CheckEqualsHelper((char *)0x100,0xc1e820,"StrtodChar(\"123456789\", 111)",1.23456789e+119,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x70);
  CheckEqualsHelper((char *)0x101,0xc1e84b,"StrtodChar(\"123456789\", 112)",1.23456789e+120,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x71);
  CheckEqualsHelper((char *)0x102,0xc1e876,"StrtodChar(\"123456789\", 113)",1.23456789e+121,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x72);
  CheckEqualsHelper((char *)0x103,0xc1e8a1,"StrtodChar(\"123456789\", 114)",1.23456789e+122,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("123456789",0x73);
  CheckEqualsHelper((char *)0x104,0xc1e8cc,"StrtodChar(\"123456789\", 115)",1.23456789e+123,
                    (char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x6c);
  CheckEqualsHelper((char *)0x107,0xc1e8f7,"StrtodChar(\"1234567890123456789012345\", 108)",
                    1.2345678901234568e+132,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x6d);
  CheckEqualsHelper((char *)0x109,0xc1e95c,"StrtodChar(\"1234567890123456789012345\", 109)",
                    1.234567890123457e+133,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x6e);
  CheckEqualsHelper((char *)0x10b,0xc1e9a7,"StrtodChar(\"1234567890123456789012345\", 110)",
                    1.2345678901234568e+134,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x6f);
  CheckEqualsHelper((char *)0x10d,0xc1e9f2,"StrtodChar(\"1234567890123456789012345\", 111)",
                    1.2345678901234567e+135,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x70);
  CheckEqualsHelper((char *)0x10f,0xc1ea3d,"StrtodChar(\"1234567890123456789012345\", 112)",
                    1.2345678901234567e+136,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x71);
  CheckEqualsHelper((char *)0x111,0xc1ea88,"StrtodChar(\"1234567890123456789012345\", 113)",
                    1.2345678901234567e+137,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x72);
  CheckEqualsHelper((char *)0x113,0xc1ead3,"StrtodChar(\"1234567890123456789012345\", 114)",
                    1.2345678901234568e+138,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789012345",0x73);
  CheckEqualsHelper((char *)0x115,0xc1eb1e,"StrtodChar(\"1234567890123456789012345\", 115)",
                    1.2345678901234568e+139,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x6c);
  CheckEqualsHelper((char *)0x118,0xc1eb69,"StrtodChar(\"1234567890123456789052345\", 108)",
                    1.2345678901234568e+132,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x6d);
  CheckEqualsHelper((char *)0x11a,0xc1ebce,"StrtodChar(\"1234567890123456789052345\", 109)",
                    1.234567890123457e+133,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x6e);
  CheckEqualsHelper((char *)0x11c,0xc1ec19,"StrtodChar(\"1234567890123456789052345\", 110)",
                    1.2345678901234568e+134,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x6f);
  CheckEqualsHelper((char *)0x11e,0xc1ec64,"StrtodChar(\"1234567890123456789052345\", 111)",
                    1.2345678901234567e+135,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x70);
  CheckEqualsHelper((char *)0x120,0xc1ecaf,"StrtodChar(\"1234567890123456789052345\", 112)",
                    1.2345678901234567e+136,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x71);
  CheckEqualsHelper((char *)0x122,0xc1ecfa,"StrtodChar(\"1234567890123456789052345\", 113)",
                    1.2345678901234567e+137,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x72);
  CheckEqualsHelper((char *)0x124,0xc1ed45,"StrtodChar(\"1234567890123456789052345\", 114)",
                    1.2345678901234568e+138,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1234567890123456789052345",0x73);
  CheckEqualsHelper((char *)0x126,0xc1ed90,"StrtodChar(\"1234567890123456789052345\", 115)",
                    1.2345678901234568e+139,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("5445618932859895362967233318697132813618813095743952975439298223406969961560047552942717636670910728746893019786283454139917900193169748259349067524939840552682198095012176093045431437495773903922425632551857520884625114624126588173520906670968542074438852601438992904761759703022688483745081090292688986958251711580854575674815074162979705098246243690189880319928315307816832576838178256307401454285988871020923752587330172447966674453785790265533466496640456213871241930958703059911787722565044368663670643970181259143319016472430928902201239474588139233890135329130660705762320235358869874608541509790266400643191187286648422874774910682648288516244021893172769161449825765517353755844373640588822904791244190695299838293263075467057383813882521706545084301049855505888186560731"
                     ,-0x40b);
  CheckEqualsHelper((char *)0x137,0xc1eddb,
                    "StrtodChar(\"5445618932859895362967233318697132813618813095743952975\" \"4392982234069699615600475529427176366709107287468930197\" \"8628345413991790019316974825934906752493984055268219809\" \"5012176093045431437495773903922425632551857520884625114\" \"6241265881735209066709685420744388526014389929047617597\" \"0302268848374508109029268898695825171158085457567481507\" \"4162979705098246243690189880319928315307816832576838178\" \"2563074014542859888710209237525873301724479666744537857\" \"9026553346649664045621387124193095870305991178772256504\" \"4368663670643970181259143319016472430928902201239474588\" \"1392338901353291306607057623202353588698746085415097902\" \"6640064319118728664842287477491068264828851624402189317\" \"2769161449825765517353755844373640588822904791244190695\" \"2998382932630754670573838138825217065450843010498555058\" \"88186560731\", -1035)"
                    ,5.445618932859895e-255,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("72057594037927928",0);
  CheckEqualsHelper((char *)0x13e,0xc1f44d,"StrtodChar(\"72057594037927928\", 0)",
                    7.205759403792793e+16,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("72057594037927936",0);
  CheckEqualsHelper((char *)0x13f,0xc1f496,"StrtodChar(\"72057594037927936\", 0)",
                    7.205759403792794e+16,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("72057594037927932",0);
  CheckEqualsHelper((char *)0x140,0xc1f496,"StrtodChar(\"72057594037927932\", 0)",
                    7.205759403792794e+16,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("7205759403792793199999",-5);
  CheckEqualsHelper((char *)0x141,0xc1f44d,"StrtodChar(\"7205759403792793199999\", -5)",
                    7.205759403792793e+16,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("7205759403792793200001",-5);
  CheckEqualsHelper((char *)0x142,0xc1f496,"StrtodChar(\"7205759403792793200001\", -5)",
                    7.205759403792794e+16,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("9223372036854774784",0);
  CheckEqualsHelper((char *)0x147,0xc1f594,"StrtodChar(\"9223372036854774784\", 0)",
                    9.223372036854775e+18,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("9223372036854775808",0);
  CheckEqualsHelper((char *)0x148,0xc1f5e3,"StrtodChar(\"9223372036854775808\", 0)",
                    9.223372036854776e+18,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("9223372036854775296",0);
  CheckEqualsHelper((char *)0x149,0xc1f5e3,"StrtodChar(\"9223372036854775296\", 0)",
                    9.223372036854776e+18,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("922337203685477529599999",-5);
  CheckEqualsHelper((char *)0x14a,0xc1f594,"StrtodChar(\"922337203685477529599999\", -5)",
                    9.223372036854775e+18,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("922337203685477529600001",-5);
  CheckEqualsHelper((char *)0x14b,0xc1f5e3,"StrtodChar(\"922337203685477529600001\", -5)",
                    9.223372036854776e+18,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("10141204801825834086073718800384",0);
  CheckEqualsHelper((char *)0x151,0xc1f6f3,"StrtodChar(\"10141204801825834086073718800384\", 0)",
                    1.0141204801825834e+31,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("10141204801825835211973625643008",0);
  CheckEqualsHelper((char *)0x153,0xc1f769,"StrtodChar(\"10141204801825835211973625643008\", 0)",
                    1.0141204801825835e+31,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("10141204801825834649023672221696",0);
  CheckEqualsHelper((char *)0x155,0xc1f769,"StrtodChar(\"10141204801825834649023672221696\", 0)",
                    1.0141204801825835e+31,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1014120480182583464902367222169599999",-5);
  CheckEqualsHelper((char *)0x157,0xc1f6f3,
                    "StrtodChar(\"1014120480182583464902367222169599999\", -5)",
                    1.0141204801825834e+31,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("1014120480182583464902367222169600001",-5);
  CheckEqualsHelper((char *)0x159,0xc1f769,
                    "StrtodChar(\"1014120480182583464902367222169600001\", -5)",
                    1.0141204801825835e+31,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("5708990770823838890407843763683279797179383808",0);
  CheckEqualsHelper((char *)0x160,0xc1f8ee,
                    "StrtodChar(\"5708990770823838890407843763683279797179383808\", 0)",
                    5.708990770823839e+45,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("5708990770823839524233143877797980545530986496",0);
  CheckEqualsHelper((char *)0x162,0xc1f98e,
                    "StrtodChar(\"5708990770823839524233143877797980545530986496\", 0)",
                    5.70899077082384e+45,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("5708990770823839207320493820740630171355185152",0);
  CheckEqualsHelper((char *)0x164,0xc1f98e,
                    "StrtodChar(\"5708990770823839207320493820740630171355185152\", 0)",
                    5.70899077082384e+45,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("5708990770823839207320493820740630171355185151999",-3);
  CheckEqualsHelper((char *)0x166,0xc1f8ee,
                    "StrtodChar(\"5708990770823839207320493820740630171355185151999\", -3)",
                    5.708990770823839e+45,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("5708990770823839207320493820740630171355185152001",-3);
  CheckEqualsHelper((char *)0x168,0xc1f98e,
                    "StrtodChar(\"5708990770823839207320493820740630171355185152001\", -3)",
                    5.70899077082384e+45,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("22250738585072011",-0x144);
  CheckEqualsHelper((char *)0x16c,0xc1fb89,"StrtodChar(\"22250738585072011\", -324)",
                    2.225073858507201e-308,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  dVar3 = StrtodChar("2225073858507201136057409796709131975934819546351645648023426109724822222021076945516529523908135087914149158913039621106870086438694594645527657207407820621743379988141063267329253552286881372149012981122451451889849057222307285255133155755015914397476397983411801999323962548289017107081850690630666655994938275772572015763062690663332647565300009245888316433037779791869612049497390377829704905051080609940730262937128958950003583799967207254304360284078895771796150945516748243471030702609144621572289880258182545180325707018860872113128079512233426288368622321503775666622503982534335974568884423900265498198385487948292206894721689831099698365846814022854243330660339850886445804001034933970427567186443383770486037861622771738545623065874679014086723327636718751"
                     ,-0x434);
  CheckEqualsHelper((char *)0x17b,0xc1fbd8,
                    "StrtodChar(\"22250738585072011360574097967091319759348195463516456480\" \"23426109724822222021076945516529523908135087914149158913\" \"03962110687008643869459464552765720740782062174337998814\" \"10632673292535522868813721490129811224514518898490572223\" \"07285255133155755015914397476397983411801999323962548289\" \"01710708185069063066665599493827577257201576306269066333\" \"26475653000092458883164330377797918696120494973903778297\" \"04905051080609940730262937128958950003583799967207254304\" \"36028407889577179615094551674824347103070260914462157228\" \"98802581825451803257070188608721131280795122334262883686\" \"22321503775666622503982534335974568884423900265498198385\" \"48794829220689472168983109969836584681402285424333066033\" \"98508864458040010349339704275671864433837704860378616227\" \"71738545623065874679014086723327636718751\", -1076)"
                    ,2.2250738585072014e-308,(char *)CONCAT44(in_register_0000000c,in_ECX),dVar3);
  return;
}

Assistant:

TEST(Strtod) {
  Vector<const char> vector;

  vector = StringToVector("0");
  CHECK_EQ(0.0, Strtod(vector, 1));
  CHECK_EQ(0.0, Strtod(vector, 2));
  CHECK_EQ(0.0, Strtod(vector, -2));
  CHECK_EQ(0.0, Strtod(vector, -999));
  CHECK_EQ(0.0, Strtod(vector, +999));

  vector = StringToVector("1");
  CHECK_EQ(1.0, Strtod(vector, 0));
  CHECK_EQ(10.0, Strtod(vector, 1));
  CHECK_EQ(100.0, Strtod(vector, 2));
  CHECK_EQ(1e20, Strtod(vector, 20));
  CHECK_EQ(1e22, Strtod(vector, 22));
  CHECK_EQ(1e23, Strtod(vector, 23));
  CHECK_EQ(1e35, Strtod(vector, 35));
  CHECK_EQ(1e36, Strtod(vector, 36));
  CHECK_EQ(1e37, Strtod(vector, 37));
  CHECK_EQ(1e-1, Strtod(vector, -1));
  CHECK_EQ(1e-2, Strtod(vector, -2));
  CHECK_EQ(1e-5, Strtod(vector, -5));
  CHECK_EQ(1e-20, Strtod(vector, -20));
  CHECK_EQ(1e-22, Strtod(vector, -22));
  CHECK_EQ(1e-23, Strtod(vector, -23));
  CHECK_EQ(1e-25, Strtod(vector, -25));
  CHECK_EQ(1e-39, Strtod(vector, -39));

  vector = StringToVector("2");
  CHECK_EQ(2.0, Strtod(vector, 0));
  CHECK_EQ(20.0, Strtod(vector, 1));
  CHECK_EQ(200.0, Strtod(vector, 2));
  CHECK_EQ(2e20, Strtod(vector, 20));
  CHECK_EQ(2e22, Strtod(vector, 22));
  CHECK_EQ(2e23, Strtod(vector, 23));
  CHECK_EQ(2e35, Strtod(vector, 35));
  CHECK_EQ(2e36, Strtod(vector, 36));
  CHECK_EQ(2e37, Strtod(vector, 37));
  CHECK_EQ(2e-1, Strtod(vector, -1));
  CHECK_EQ(2e-2, Strtod(vector, -2));
  CHECK_EQ(2e-5, Strtod(vector, -5));
  CHECK_EQ(2e-20, Strtod(vector, -20));
  CHECK_EQ(2e-22, Strtod(vector, -22));
  CHECK_EQ(2e-23, Strtod(vector, -23));
  CHECK_EQ(2e-25, Strtod(vector, -25));
  CHECK_EQ(2e-39, Strtod(vector, -39));

  vector = StringToVector("9");
  CHECK_EQ(9.0, Strtod(vector, 0));
  CHECK_EQ(90.0, Strtod(vector, 1));
  CHECK_EQ(900.0, Strtod(vector, 2));
  CHECK_EQ(9e20, Strtod(vector, 20));
  CHECK_EQ(9e22, Strtod(vector, 22));
  CHECK_EQ(9e23, Strtod(vector, 23));
  CHECK_EQ(9e35, Strtod(vector, 35));
  CHECK_EQ(9e36, Strtod(vector, 36));
  CHECK_EQ(9e37, Strtod(vector, 37));
  CHECK_EQ(9e-1, Strtod(vector, -1));
  CHECK_EQ(9e-2, Strtod(vector, -2));
  CHECK_EQ(9e-5, Strtod(vector, -5));
  CHECK_EQ(9e-20, Strtod(vector, -20));
  CHECK_EQ(9e-22, Strtod(vector, -22));
  CHECK_EQ(9e-23, Strtod(vector, -23));
  CHECK_EQ(9e-25, Strtod(vector, -25));
  CHECK_EQ(9e-39, Strtod(vector, -39));

  vector = StringToVector("12345");
  CHECK_EQ(12345.0, Strtod(vector, 0));
  CHECK_EQ(123450.0, Strtod(vector, 1));
  CHECK_EQ(1234500.0, Strtod(vector, 2));
  CHECK_EQ(12345e20, Strtod(vector, 20));
  CHECK_EQ(12345e22, Strtod(vector, 22));
  CHECK_EQ(12345e23, Strtod(vector, 23));
  CHECK_EQ(12345e30, Strtod(vector, 30));
  CHECK_EQ(12345e31, Strtod(vector, 31));
  CHECK_EQ(12345e32, Strtod(vector, 32));
  CHECK_EQ(12345e35, Strtod(vector, 35));
  CHECK_EQ(12345e36, Strtod(vector, 36));
  CHECK_EQ(12345e37, Strtod(vector, 37));
  CHECK_EQ(12345e-1, Strtod(vector, -1));
  CHECK_EQ(12345e-2, Strtod(vector, -2));
  CHECK_EQ(12345e-5, Strtod(vector, -5));
  CHECK_EQ(12345e-20, Strtod(vector, -20));
  CHECK_EQ(12345e-22, Strtod(vector, -22));
  CHECK_EQ(12345e-23, Strtod(vector, -23));
  CHECK_EQ(12345e-25, Strtod(vector, -25));
  CHECK_EQ(12345e-39, Strtod(vector, -39));

  vector = StringToVector("12345678901234");
  CHECK_EQ(12345678901234.0, Strtod(vector, 0));
  CHECK_EQ(123456789012340.0, Strtod(vector, 1));
  CHECK_EQ(1234567890123400.0, Strtod(vector, 2));
  CHECK_EQ(12345678901234e20, Strtod(vector, 20));
  CHECK_EQ(12345678901234e22, Strtod(vector, 22));
  CHECK_EQ(12345678901234e23, Strtod(vector, 23));
  CHECK_EQ(12345678901234e30, Strtod(vector, 30));
  CHECK_EQ(12345678901234e31, Strtod(vector, 31));
  CHECK_EQ(12345678901234e32, Strtod(vector, 32));
  CHECK_EQ(12345678901234e35, Strtod(vector, 35));
  CHECK_EQ(12345678901234e36, Strtod(vector, 36));
  CHECK_EQ(12345678901234e37, Strtod(vector, 37));
  CHECK_EQ(12345678901234e-1, Strtod(vector, -1));
  CHECK_EQ(12345678901234e-2, Strtod(vector, -2));
  CHECK_EQ(12345678901234e-5, Strtod(vector, -5));
  CHECK_EQ(12345678901234e-20, Strtod(vector, -20));
  CHECK_EQ(12345678901234e-22, Strtod(vector, -22));
  CHECK_EQ(12345678901234e-23, Strtod(vector, -23));
  CHECK_EQ(12345678901234e-25, Strtod(vector, -25));
  CHECK_EQ(12345678901234e-39, Strtod(vector, -39));

  vector = StringToVector("123456789012345");
  CHECK_EQ(123456789012345.0, Strtod(vector, 0));
  CHECK_EQ(1234567890123450.0, Strtod(vector, 1));
  CHECK_EQ(12345678901234500.0, Strtod(vector, 2));
  CHECK_EQ(123456789012345e20, Strtod(vector, 20));
  CHECK_EQ(123456789012345e22, Strtod(vector, 22));
  CHECK_EQ(123456789012345e23, Strtod(vector, 23));
  CHECK_EQ(123456789012345e35, Strtod(vector, 35));
  CHECK_EQ(123456789012345e36, Strtod(vector, 36));
  CHECK_EQ(123456789012345e37, Strtod(vector, 37));
  CHECK_EQ(123456789012345e39, Strtod(vector, 39));
  CHECK_EQ(123456789012345e-1, Strtod(vector, -1));
  CHECK_EQ(123456789012345e-2, Strtod(vector, -2));
  CHECK_EQ(123456789012345e-5, Strtod(vector, -5));
  CHECK_EQ(123456789012345e-20, Strtod(vector, -20));
  CHECK_EQ(123456789012345e-22, Strtod(vector, -22));
  CHECK_EQ(123456789012345e-23, Strtod(vector, -23));
  CHECK_EQ(123456789012345e-25, Strtod(vector, -25));
  CHECK_EQ(123456789012345e-39, Strtod(vector, -39));

  CHECK_EQ(0.0, StrtodChar("0", 12345));
  CHECK_EQ(0.0, StrtodChar("", 1324));
  CHECK_EQ(0.0, StrtodChar("000000000", 123));
  CHECK_EQ(0.0, StrtodChar("2", -324));
  CHECK_EQ(4e-324, StrtodChar("3", -324));
  // It would be more readable to put non-zero literals on the left side (i.e.
  //   CHECK_EQ(1e-325, StrtodChar("1", -325))), but then Gcc complains that
  // they are truncated to zero.
  CHECK_EQ(0.0, StrtodChar("1", -325));
  CHECK_EQ(0.0, StrtodChar("1", -325));
  CHECK_EQ(0.0, StrtodChar("20000", -328));
  CHECK_EQ(40000e-328, StrtodChar("30000", -328));
  CHECK_EQ(0.0, StrtodChar("10000", -329));
  CHECK_EQ(0.0, StrtodChar("90000", -329));
  CHECK_EQ(0.0, StrtodChar("000000001", -325));
  CHECK_EQ(0.0, StrtodChar("000000001", -325));
  CHECK_EQ(0.0, StrtodChar("0000000020000", -328));
  CHECK_EQ(40000e-328, StrtodChar("00000030000", -328));
  CHECK_EQ(0.0, StrtodChar("0000000010000", -329));
  CHECK_EQ(0.0, StrtodChar("0000000090000", -329));

  // It would be more readable to put the literals (and not Double::Infinity())
  // on the left side (i.e. CHECK_EQ(1e309, StrtodChar("1", 309))), but then Gcc
  // complains that the floating constant exceeds range of 'double'.
  CHECK_EQ(Double::Infinity(), StrtodChar("1", 309));
  CHECK_EQ(1e308, StrtodChar("1", 308));
  CHECK_EQ(1234e305, StrtodChar("1234", 305));
  CHECK_EQ(1234e304, StrtodChar("1234", 304));
  CHECK_EQ(Double::Infinity(), StrtodChar("18", 307));
  CHECK_EQ(17e307, StrtodChar("17", 307));
  CHECK_EQ(Double::Infinity(), StrtodChar("0000001", 309));
  CHECK_EQ(1e308, StrtodChar("00000001", 308));
  CHECK_EQ(1234e305, StrtodChar("00000001234", 305));
  CHECK_EQ(1234e304, StrtodChar("000000001234", 304));
  CHECK_EQ(Double::Infinity(), StrtodChar("0000000018", 307));
  CHECK_EQ(17e307, StrtodChar("0000000017", 307));
  CHECK_EQ(Double::Infinity(), StrtodChar("1000000", 303));
  CHECK_EQ(1e308, StrtodChar("100000", 303));
  CHECK_EQ(1234e305, StrtodChar("123400000", 300));
  CHECK_EQ(1234e304, StrtodChar("123400000", 299));
  CHECK_EQ(Double::Infinity(), StrtodChar("180000000", 300));
  CHECK_EQ(17e307, StrtodChar("170000000", 300));
  CHECK_EQ(Double::Infinity(), StrtodChar("00000001000000", 303));
  CHECK_EQ(1e308, StrtodChar("000000000000100000", 303));
  CHECK_EQ(1234e305, StrtodChar("00000000123400000", 300));
  CHECK_EQ(1234e304, StrtodChar("0000000123400000", 299));
  CHECK_EQ(Double::Infinity(), StrtodChar("00000000180000000", 300));
  CHECK_EQ(17e307, StrtodChar("00000000170000000", 300));
  CHECK_EQ(1.7976931348623157E+308, StrtodChar("17976931348623157", 292));
  CHECK_EQ(1.7976931348623158E+308, StrtodChar("17976931348623158", 292));
  CHECK_EQ(Double::Infinity(), StrtodChar("17976931348623159", 292));

  // The following number is the result of 89255.0/1e-22. Both floating-point
  // numbers can be accurately represented with doubles. However on Linux,x86
  // the floating-point stack is set to 80bits and the double-rounding
  // introduces an error.
  CHECK_EQ(89255e-22, StrtodChar("89255", -22));

  // Some random values.
  CHECK_EQ(358416272e-33, StrtodChar("358416272", -33));
  CHECK_EQ(104110013277974872254e-225,
           StrtodChar("104110013277974872254", -225));

  CHECK_EQ(123456789e108, StrtodChar("123456789", 108));
  CHECK_EQ(123456789e109, StrtodChar("123456789", 109));
  CHECK_EQ(123456789e110, StrtodChar("123456789", 110));
  CHECK_EQ(123456789e111, StrtodChar("123456789", 111));
  CHECK_EQ(123456789e112, StrtodChar("123456789", 112));
  CHECK_EQ(123456789e113, StrtodChar("123456789", 113));
  CHECK_EQ(123456789e114, StrtodChar("123456789", 114));
  CHECK_EQ(123456789e115, StrtodChar("123456789", 115));

  CHECK_EQ(1234567890123456789012345e108,
           StrtodChar("1234567890123456789012345", 108));
  CHECK_EQ(1234567890123456789012345e109,
           StrtodChar("1234567890123456789012345", 109));
  CHECK_EQ(1234567890123456789012345e110,
           StrtodChar("1234567890123456789012345", 110));
  CHECK_EQ(1234567890123456789012345e111,
           StrtodChar("1234567890123456789012345", 111));
  CHECK_EQ(1234567890123456789012345e112,
           StrtodChar("1234567890123456789012345", 112));
  CHECK_EQ(1234567890123456789012345e113,
           StrtodChar("1234567890123456789012345", 113));
  CHECK_EQ(1234567890123456789012345e114,
           StrtodChar("1234567890123456789012345", 114));
  CHECK_EQ(1234567890123456789012345e115,
           StrtodChar("1234567890123456789012345", 115));

  CHECK_EQ(1234567890123456789052345e108,
           StrtodChar("1234567890123456789052345", 108));
  CHECK_EQ(1234567890123456789052345e109,
           StrtodChar("1234567890123456789052345", 109));
  CHECK_EQ(1234567890123456789052345e110,
           StrtodChar("1234567890123456789052345", 110));
  CHECK_EQ(1234567890123456789052345e111,
           StrtodChar("1234567890123456789052345", 111));
  CHECK_EQ(1234567890123456789052345e112,
           StrtodChar("1234567890123456789052345", 112));
  CHECK_EQ(1234567890123456789052345e113,
           StrtodChar("1234567890123456789052345", 113));
  CHECK_EQ(1234567890123456789052345e114,
           StrtodChar("1234567890123456789052345", 114));
  CHECK_EQ(1234567890123456789052345e115,
           StrtodChar("1234567890123456789052345", 115));

  CHECK_EQ(5.445618932859895e-255,
           StrtodChar("5445618932859895362967233318697132813618813095743952975"
                      "4392982234069699615600475529427176366709107287468930197"
                      "8628345413991790019316974825934906752493984055268219809"
                      "5012176093045431437495773903922425632551857520884625114"
                      "6241265881735209066709685420744388526014389929047617597"
                      "0302268848374508109029268898695825171158085457567481507"
                      "4162979705098246243690189880319928315307816832576838178"
                      "2563074014542859888710209237525873301724479666744537857"
                      "9026553346649664045621387124193095870305991178772256504"
                      "4368663670643970181259143319016472430928902201239474588"
                      "1392338901353291306607057623202353588698746085415097902"
                      "6640064319118728664842287477491068264828851624402189317"
                      "2769161449825765517353755844373640588822904791244190695"
                      "2998382932630754670573838138825217065450843010498555058"
                      "88186560731", -1035));

  // Boundary cases. Boundaries themselves should round to even.
  //
  // 0x1FFFFFFFFFFFF * 2^3 = 72057594037927928
  //                   next: 72057594037927936
  //               boundary: 72057594037927932  should round up.
  CHECK_EQ(72057594037927928.0, StrtodChar("72057594037927928", 0));
  CHECK_EQ(72057594037927936.0, StrtodChar("72057594037927936", 0));
  CHECK_EQ(72057594037927936.0, StrtodChar("72057594037927932", 0));
  CHECK_EQ(72057594037927928.0, StrtodChar("7205759403792793199999", -5));
  CHECK_EQ(72057594037927936.0, StrtodChar("7205759403792793200001", -5));

  // 0x1FFFFFFFFFFFF * 2^10 = 9223372036854774784
  //                    next: 9223372036854775808
  //                boundary: 9223372036854775296 should round up.
  CHECK_EQ(9223372036854774784.0, StrtodChar("9223372036854774784", 0));
  CHECK_EQ(9223372036854775808.0, StrtodChar("9223372036854775808", 0));
  CHECK_EQ(9223372036854775808.0, StrtodChar("9223372036854775296", 0));
  CHECK_EQ(9223372036854774784.0, StrtodChar("922337203685477529599999", -5));
  CHECK_EQ(9223372036854775808.0, StrtodChar("922337203685477529600001", -5));

  // 0x1FFFFFFFFFFFF * 2^50 = 10141204801825834086073718800384
  //                    next: 10141204801825835211973625643008
  //                boundary: 10141204801825834649023672221696 should round up.
  CHECK_EQ(10141204801825834086073718800384.0,
           StrtodChar("10141204801825834086073718800384", 0));
  CHECK_EQ(10141204801825835211973625643008.0,
           StrtodChar("10141204801825835211973625643008", 0));
  CHECK_EQ(10141204801825835211973625643008.0,
           StrtodChar("10141204801825834649023672221696", 0));
  CHECK_EQ(10141204801825834086073718800384.0,
           StrtodChar("1014120480182583464902367222169599999", -5));
  CHECK_EQ(10141204801825835211973625643008.0,
           StrtodChar("1014120480182583464902367222169600001", -5));

  // 0x1FFFFFFFFFFFF * 2^99 = 5708990770823838890407843763683279797179383808
  //                    next: 5708990770823839524233143877797980545530986496
  //                boundary: 5708990770823839207320493820740630171355185152
  // The boundary should round up.
  CHECK_EQ(5708990770823838890407843763683279797179383808.0,
           StrtodChar("5708990770823838890407843763683279797179383808", 0));
  CHECK_EQ(5708990770823839524233143877797980545530986496.0,
           StrtodChar("5708990770823839524233143877797980545530986496", 0));
  CHECK_EQ(5708990770823839524233143877797980545530986496.0,
           StrtodChar("5708990770823839207320493820740630171355185152", 0));
  CHECK_EQ(5708990770823838890407843763683279797179383808.0,
           StrtodChar("5708990770823839207320493820740630171355185151999", -3));
  CHECK_EQ(5708990770823839524233143877797980545530986496.0,
           StrtodChar("5708990770823839207320493820740630171355185152001", -3));

  // The following test-cases got some public attention in early 2011 when they
  // sent Java and PHP into an infinite loop.
  CHECK_EQ(2.225073858507201e-308, StrtodChar("22250738585072011", -324));
  CHECK_EQ(2.22507385850720138309e-308,
           StrtodChar("22250738585072011360574097967091319759348195463516456480"
                      "23426109724822222021076945516529523908135087914149158913"
                      "03962110687008643869459464552765720740782062174337998814"
                      "10632673292535522868813721490129811224514518898490572223"
                      "07285255133155755015914397476397983411801999323962548289"
                      "01710708185069063066665599493827577257201576306269066333"
                      "26475653000092458883164330377797918696120494973903778297"
                      "04905051080609940730262937128958950003583799967207254304"
                      "36028407889577179615094551674824347103070260914462157228"
                      "98802581825451803257070188608721131280795122334262883686"
                      "22321503775666622503982534335974568884423900265498198385"
                      "48794829220689472168983109969836584681402285424333066033"
                      "98508864458040010349339704275671864433837704860378616227"
                      "71738545623065874679014086723327636718751", -1076));
}